

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int getID(InternalInstruction *insn)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  InstructionSpecifier *pIVar4;
  InternalInstruction *in_RDI;
  InstructionSpecifier *specWithNewOpcode;
  uint16_t instructionIDWithNewOpcode;
  InstructionSpecifier *spec_1;
  uint16_t instructionIDWithOpsize;
  InstructionSpecifier *spec;
  uint16_t instructionIDWithREXW;
  uint16_t instructionID;
  uint16_t attrMask;
  uint16_t in_stack_ffffffffffffffae;
  uint in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  InstrUID local_32;
  ushort local_22;
  uint16_t local_16;
  InstrUID local_14;
  int local_4;
  
  if (in_RDI->vectorExtensionType == TYPE_NO_VEX_XOP) {
    if ((in_RDI->mode == MODE_16BIT) ||
       (_Var2 = isPrefixAtLocation(in_RDI,'f',in_RDI->necessaryPrefixLocation), !_Var2)) {
      _Var2 = isPrefixAtLocation(in_RDI,'g',in_RDI->necessaryPrefixLocation);
      if ((!_Var2) &&
         (((in_RDI->mode == MODE_16BIT ||
           (_Var2 = isPrefixAtLocation(in_RDI,0xf3,in_RDI->necessaryPrefixLocation), !_Var2)) &&
          (in_RDI->mode != MODE_16BIT)))) {
        isPrefixAtLocation(in_RDI,0xf2,in_RDI->necessaryPrefixLocation);
      }
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
    if (in_RDI->vectorExtensionType == TYPE_EVEX) {
      in_stack_ffffffffffffffbc = in_RDI->vectorExtensionPrefix[2] & 3;
      if (in_stack_ffffffffffffffbc == 1) {
        bVar1 = true;
      }
      else if (in_stack_ffffffffffffffbc == 2) {
        bVar1 = false;
      }
      else if (in_stack_ffffffffffffffbc == 3) {
        bVar1 = false;
      }
    }
    else if (in_RDI->vectorExtensionType == TYPE_VEX_3B) {
      in_stack_ffffffffffffffb8 = in_RDI->vectorExtensionPrefix[2] & 3;
      if (in_stack_ffffffffffffffb8 == 1) {
        bVar1 = true;
      }
      else if (in_stack_ffffffffffffffb8 == 2) {
        bVar1 = false;
      }
      else if (in_stack_ffffffffffffffb8 == 3) {
        bVar1 = false;
      }
    }
    else if (in_RDI->vectorExtensionType == TYPE_VEX_2B) {
      in_stack_ffffffffffffffb4 = in_RDI->vectorExtensionPrefix[1] & 3;
      if (in_stack_ffffffffffffffb4 == 1) {
        bVar1 = true;
      }
      else if (in_stack_ffffffffffffffb4 == 2) {
        bVar1 = false;
      }
      else if (in_stack_ffffffffffffffb4 == 3) {
        bVar1 = false;
      }
    }
    else {
      if (in_RDI->vectorExtensionType != TYPE_XOP) {
        return -1;
      }
      in_stack_ffffffffffffffb0 = in_RDI->vectorExtensionPrefix[2] & 3;
      if (in_stack_ffffffffffffffb0 == 1) {
        bVar1 = true;
      }
      else if (in_stack_ffffffffffffffb0 == 2) {
        bVar1 = false;
      }
      else if (in_stack_ffffffffffffffb0 == 3) {
        bVar1 = false;
      }
    }
  }
  iVar3 = getIDWithAttrMask((uint16_t *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                            (InternalInstruction *)
                            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffae);
  if (iVar3 != 0) {
    return -1;
  }
  if (((in_RDI->mode != MODE_64BIT) && (in_RDI->vectorExtensionType != TYPE_NO_VEX_XOP)) &&
     ((((in_RDI->vectorExtensionType == TYPE_EVEX &&
        ((int)(in_RDI->vectorExtensionPrefix[2] & 0x80) >> 7 != 0)) ||
       ((in_RDI->vectorExtensionType == TYPE_VEX_3B &&
        ((int)(in_RDI->vectorExtensionPrefix[2] & 0x80) >> 7 != 0)))) ||
      ((in_RDI->vectorExtensionType == TYPE_XOP &&
       ((int)(in_RDI->vectorExtensionPrefix[2] & 0x80) >> 7 != 0)))))) {
    iVar3 = getIDWithAttrMask((uint16_t *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (InternalInstruction *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffae);
    if (iVar3 != 0) {
      in_RDI->instructionID = local_14;
      pIVar4 = specifierForUID(local_14);
      in_RDI->spec = pIVar4;
      return 0;
    }
    _Var2 = is64Bit(local_16);
    if (!_Var2) {
      in_RDI->instructionID = local_16;
      pIVar4 = specifierForUID(local_16);
      in_RDI->spec = pIVar4;
      return 0;
    }
  }
  if ((in_RDI->opcodeType == ONEBYTE) && ((in_RDI->opcode & 0xfc) == 0xa0)) {
    iVar3 = getIDWithAttrMask((uint16_t *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (InternalInstruction *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffae);
    if (iVar3 == 0) {
      in_RDI->instructionID = local_14;
      pIVar4 = specifierForUID(local_14);
      in_RDI->spec = pIVar4;
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  else if (((in_RDI->mode != MODE_16BIT) && ((in_RDI->isPrefix66 & 1U) == 0)) || (bVar1)) {
    if (((in_RDI->opcodeType == ONEBYTE) && (in_RDI->opcode == 0x90)) &&
       ((in_RDI->rexPrefix & 1) != 0)) {
      pIVar4 = specifierForUID(local_14);
      in_RDI->opcode = 0x91;
      iVar3 = getIDWithAttrMask((uint16_t *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                                (InternalInstruction *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffae);
      if (iVar3 == 0) {
        pIVar4 = specifierForUID(local_32);
        in_RDI->opcode = 0x90;
        in_RDI->instructionID = local_32;
        in_RDI->spec = pIVar4;
        local_4 = 0;
      }
      else {
        in_RDI->opcode = 0x90;
        in_RDI->instructionID = local_14;
        in_RDI->spec = pIVar4;
        local_4 = 0;
      }
    }
    else {
      in_RDI->instructionID = local_14;
      pIVar4 = specifierForUID(in_RDI->instructionID);
      in_RDI->spec = pIVar4;
      local_4 = 0;
    }
  }
  else {
    pIVar4 = specifierForUID(local_14);
    iVar3 = getIDWithAttrMask((uint16_t *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                              (InternalInstruction *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffae);
    if (iVar3 == 0) {
      _Var2 = is16BitEquivalent((uint)local_14,(uint)local_22);
      if ((_Var2) && ((in_RDI->mode == MODE_16BIT) != (bool)(in_RDI->isPrefix66 & 1U))) {
        in_RDI->instructionID = local_22;
        pIVar4 = specifierForUID(local_22);
        in_RDI->spec = pIVar4;
      }
      else {
        in_RDI->instructionID = local_14;
        in_RDI->spec = pIVar4;
      }
      local_4 = 0;
    }
    else {
      in_RDI->instructionID = local_14;
      in_RDI->spec = pIVar4;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int getID(struct InternalInstruction *insn)
{
	uint16_t attrMask;
	uint16_t instructionID;

	// printf(">>> getID()\n");
	attrMask = ATTR_NONE;

	if (insn->mode == MODE_64BIT)
		attrMask |= ATTR_64BIT;

	if (insn->vectorExtensionType != TYPE_NO_VEX_XOP) {
		attrMask |= (insn->vectorExtensionType == TYPE_EVEX) ? ATTR_EVEX : ATTR_VEX;

		if (insn->vectorExtensionType == TYPE_EVEX) {
			switch (ppFromEVEX3of4(insn->vectorExtensionPrefix[2])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (zFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXKZ;
			if (bFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXB;
			if (aaaFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXK;
			if (lFromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXL;
			if (l2FromEVEX4of4(insn->vectorExtensionPrefix[3]))
				attrMask |= ATTR_EVEXL2;
		} else if (insn->vectorExtensionType == TYPE_VEX_3B) {
			switch (ppFromVEX3of3(insn->vectorExtensionPrefix[2])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (lFromVEX3of3(insn->vectorExtensionPrefix[2]))
				attrMask |= ATTR_VEXL;
		} else if (insn->vectorExtensionType == TYPE_VEX_2B) {
			switch (ppFromVEX2of2(insn->vectorExtensionPrefix[1])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (lFromVEX2of2(insn->vectorExtensionPrefix[1]))
				attrMask |= ATTR_VEXL;
		} else if (insn->vectorExtensionType == TYPE_XOP) {
			switch (ppFromXOP3of3(insn->vectorExtensionPrefix[2])) {
				case VEX_PREFIX_66:
					attrMask |= ATTR_OPSIZE;
					break;
				case VEX_PREFIX_F3:
					attrMask |= ATTR_XS;
					break;
				case VEX_PREFIX_F2:
					attrMask |= ATTR_XD;
					break;
			}

			if (lFromXOP3of3(insn->vectorExtensionPrefix[2]))
				attrMask |= ATTR_VEXL;
		} else {
			return -1;
		}
	} else {
		if (insn->mode != MODE_16BIT && isPrefixAtLocation(insn, 0x66, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_OPSIZE;
		} else if (isPrefixAtLocation(insn, 0x67, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_ADSIZE;
		} else if (insn->mode != MODE_16BIT && isPrefixAtLocation(insn, 0xf3, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_XS;
		} else if (insn->mode != MODE_16BIT && isPrefixAtLocation(insn, 0xf2, insn->necessaryPrefixLocation)) {
			attrMask |= ATTR_XD;
		}
	}

	if (insn->rexPrefix & 0x08)
		attrMask |= ATTR_REXW;

	/*
	 * JCXZ/JECXZ need special handling for 16-bit mode because the meaning
	 * of the AdSize prefix is inverted w.r.t. 32-bit mode.
	 */
	if (insn->mode == MODE_16BIT && insn->opcodeType == ONEBYTE &&
			insn->opcode == 0xE3)
		attrMask ^= ATTR_ADSIZE;

	if (getIDWithAttrMask(&instructionID, insn, attrMask))
		return -1;

	/* The following clauses compensate for limitations of the tables. */
	if (insn->mode != MODE_64BIT &&
			insn->vectorExtensionType != TYPE_NO_VEX_XOP) {
		/*
		 * The tables can't distinquish between cases where the W-bit is used to
		 * select register size and cases where its a required part of the opcode.
		 */
		if ((insn->vectorExtensionType == TYPE_EVEX &&
					wFromEVEX3of4(insn->vectorExtensionPrefix[2])) ||
				(insn->vectorExtensionType == TYPE_VEX_3B &&
				 wFromVEX3of3(insn->vectorExtensionPrefix[2])) ||
				(insn->vectorExtensionType == TYPE_XOP &&
				 wFromXOP3of3(insn->vectorExtensionPrefix[2]))) {
			uint16_t instructionIDWithREXW;
			if (getIDWithAttrMask(&instructionIDWithREXW,
						insn, attrMask | ATTR_REXW)) {
				insn->instructionID = instructionID;
				insn->spec = specifierForUID(instructionID);

				return 0;
			}

			// If not a 64-bit instruction. Switch the opcode.
			if (!is64Bit(instructionIDWithREXW)) {
				insn->instructionID = instructionIDWithREXW;
				insn->spec = specifierForUID(instructionIDWithREXW);

				return 0;
			}
		}
	}

	/*
	 * Absolute moves need special handling.
	 * -For 16-bit mode because the meaning of the AdSize and OpSize prefixes are
	 *  inverted w.r.t.
	 * -For 32-bit mode we need to ensure the ADSIZE prefix is observed in
	 *  any position.
	 */
	if (insn->opcodeType == ONEBYTE && ((insn->opcode & 0xFC) == 0xA0)) {
		/* Make sure we observed the prefixes in any position. */
		if (insn->isPrefix67)
			attrMask |= ATTR_ADSIZE;
		if (insn->isPrefix66)
			attrMask |= ATTR_OPSIZE;

		/* In 16-bit, invert the attributes. */
		if (insn->mode == MODE_16BIT)
			attrMask ^= ATTR_ADSIZE | ATTR_OPSIZE;

		if (getIDWithAttrMask(&instructionID, insn, attrMask))
			return -1;

		insn->instructionID = instructionID;
		insn->spec = specifierForUID(instructionID);

		return 0;
	}

	if ((insn->mode == MODE_16BIT || insn->isPrefix66) &&
			!(attrMask & ATTR_OPSIZE)) {
		/*
		 * The instruction tables make no distinction between instructions that
		 * allow OpSize anywhere (i.e., 16-bit operations) and that need it in a
		 * particular spot (i.e., many MMX operations).  In general we're
		 * conservative, but in the specific case where OpSize is present but not
		 * in the right place we check if there's a 16-bit operation.
		 */

		const struct InstructionSpecifier *spec;
		uint16_t instructionIDWithOpsize;

		spec = specifierForUID(instructionID);

		if (getIDWithAttrMask(&instructionIDWithOpsize,
					insn, attrMask | ATTR_OPSIZE)) {
			/*
			 * ModRM required with OpSize but not present; give up and return version
			 * without OpSize set
			 */

			insn->instructionID = instructionID;
			insn->spec = spec;
			return 0;
		}

		if (is16BitEquivalent(instructionID, instructionIDWithOpsize) &&
				(insn->mode == MODE_16BIT) ^ insn->isPrefix66) {
			insn->instructionID = instructionIDWithOpsize;
			insn->spec = specifierForUID(instructionIDWithOpsize);
		} else {
			insn->instructionID = instructionID;
			insn->spec = spec;
		}
		return 0;
	}

	if (insn->opcodeType == ONEBYTE && insn->opcode == 0x90 &&
			insn->rexPrefix & 0x01) {
		/*
		 * NOOP shouldn't decode as NOOP if REX.b is set. Instead
		 * it should decode as XCHG %r8, %eax.
		 */

		const struct InstructionSpecifier *spec;
		uint16_t instructionIDWithNewOpcode;
		const struct InstructionSpecifier *specWithNewOpcode;

		spec = specifierForUID(instructionID);

		/* Borrow opcode from one of the other XCHGar opcodes */
		insn->opcode = 0x91;

		if (getIDWithAttrMask(&instructionIDWithNewOpcode,
					insn,
					attrMask)) {
			insn->opcode = 0x90;

			insn->instructionID = instructionID;
			insn->spec = spec;
			return 0;
		}

		specWithNewOpcode = specifierForUID(instructionIDWithNewOpcode);

		/* Change back */
		insn->opcode = 0x90;

		insn->instructionID = instructionIDWithNewOpcode;
		insn->spec = specWithNewOpcode;

		return 0;
	}

	insn->instructionID = instructionID;
	insn->spec = specifierForUID(insn->instructionID);

	return 0;
}